

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

int32_t createLikelySubtagsString
                  (char *lang,int32_t langLength,char *script,int32_t scriptLength,char *region,
                  int32_t regionLength,char *variants,int32_t variantsLength,char *tag,
                  int32_t tagCapacity,UErrorCode *err)

{
  int32_t iVar1;
  char *alternateTags;
  UErrorCode *pUVar2;
  char tagBuffer [157];
  char likelySubtagsBuffer [157];
  
  if (U_ZERO_ERROR < *err) {
    return -1;
  }
  iVar1 = (int32_t)err;
  if (regionLength < 1 || scriptLength < 1) {
    if (0 < scriptLength) goto LAB_00279462;
LAB_002794f2:
    if (0 < regionLength) {
      pUVar2 = (UErrorCode *)0x0;
      createTagString(lang,langLength,(char *)0x0,0,region,regionLength,(char *)0x0,0,tagBuffer,0x9d
                      ,err);
      if (U_ZERO_ERROR < *err) {
        return -1;
      }
      alternateTags = findLikelySubtags(tagBuffer,likelySubtagsBuffer,iVar1,pUVar2);
      if (U_ZERO_ERROR < *err) {
        return -1;
      }
      if (alternateTags != (char *)0x0) goto LAB_00279584;
    }
    pUVar2 = (UErrorCode *)0x0;
    createTagString(lang,langLength,(char *)0x0,0,(char *)0x0,0,(char *)0x0,0,tagBuffer,0x9d,err);
    if (U_ZERO_ERROR < *err) {
      return -1;
    }
    alternateTags = findLikelySubtags(tagBuffer,likelySubtagsBuffer,iVar1,pUVar2);
    if (U_ZERO_ERROR < *err) {
      return -1;
    }
    if (alternateTags == (char *)0x0) {
      iVar1 = u_terminateChars_63(tag,tagCapacity,0,err);
      return iVar1;
    }
  }
  else {
    pUVar2 = (UErrorCode *)(ulong)(uint)scriptLength;
    createTagString(lang,langLength,script,scriptLength,region,regionLength,(char *)0x0,0,tagBuffer,
                    0x9d,err);
    if (U_ZERO_ERROR < *err) {
      return -1;
    }
    alternateTags = findLikelySubtags(tagBuffer,likelySubtagsBuffer,iVar1,pUVar2);
    if (U_ZERO_ERROR < *err) {
      return -1;
    }
    if (alternateTags == (char *)0x0) {
LAB_00279462:
      pUVar2 = (UErrorCode *)(ulong)(uint)scriptLength;
      createTagString(lang,langLength,script,scriptLength,(char *)0x0,0,(char *)0x0,0,tagBuffer,0x9d
                      ,err);
      if (U_ZERO_ERROR < *err) {
        return -1;
      }
      alternateTags = findLikelySubtags(tagBuffer,likelySubtagsBuffer,iVar1,pUVar2);
      if (U_ZERO_ERROR < *err) {
        return -1;
      }
      if (alternateTags != (char *)0x0) {
        script = (char *)0x0;
        scriptLength = 0;
        goto LAB_0027958a;
      }
      goto LAB_002794f2;
    }
    script = (char *)0x0;
    scriptLength = 0;
LAB_00279584:
    region = (char *)0x0;
    regionLength = 0;
  }
LAB_0027958a:
  iVar1 = createTagStringWithAlternates
                    ((char *)0x0,0,script,scriptLength,region,regionLength,variants,variantsLength,
                     alternateTags,tag,tagCapacity,err);
  return iVar1;
}

Assistant:

static int32_t U_CALLCONV
createLikelySubtagsString(
    const char* lang,
    int32_t langLength,
    const char* script,
    int32_t scriptLength,
    const char* region,
    int32_t regionLength,
    const char* variants,
    int32_t variantsLength,
    char* tag,
    int32_t tagCapacity,
    UErrorCode* err)
{
    /**
     * ULOC_FULLNAME_CAPACITY will provide enough capacity
     * that we can build a string that contains the language,
     * script and region code without worrying about overrunning
     * the user-supplied buffer.
     **/
    char tagBuffer[ULOC_FULLNAME_CAPACITY];
    char likelySubtagsBuffer[ULOC_FULLNAME_CAPACITY];

    if(U_FAILURE(*err)) {
        goto error;
    }

    /**
     * Try the language with the script and region first.
     **/
    if (scriptLength > 0 && regionLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            script,
            scriptLength,
            region,
            regionLength,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        NULL,
                        0,
                        NULL,
                        0,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Try the language with just the script.
     **/
    if (scriptLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            script,
            scriptLength,
            NULL,
            0,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        NULL,
                        0,
                        region,
                        regionLength,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Try the language with just the region.
     **/
    if (regionLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            NULL,
            0,
            region,
            regionLength,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        script,
                        scriptLength,
                        NULL,
                        0,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Finally, try just the language.
     **/
    {
        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            NULL,
            0,
            NULL,
            0,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        script,
                        scriptLength,
                        region,
                        regionLength,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    return u_terminateChars(
                tag,
                tagCapacity,
                0,
                err);

error:

    if (!U_FAILURE(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    return -1;
}